

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,double v)

{
  Value local_28;
  double local_18;
  double v_local;
  SampleBuilder *this_local;
  
  local_18 = v;
  v_local = (double)this;
  Value::Value(&local_28,v);
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::push_back
            (&this->m_values,&local_28);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(double v)	{ m_values.push_back(Value(v));				return *this; }